

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O0

ex_ex * ex_eval(expr *expr,ex_ex *eptr,ex_ex *optr,int idx)

{
  long lVar1;
  bool bVar2;
  ex_ex *peVar3;
  anon_union_8_5_735de1bb_for_ex_cont *paVar4;
  anon_union_8_5_735de1bb_for_ex_cont local_88;
  ex_ex right;
  ex_ex left;
  int nullret;
  t_float scalar;
  t_float *op;
  t_float *rp;
  t_float *lp;
  int j;
  int i;
  int idx_local;
  ex_ex *optr_local;
  ex_ex *eptr_local;
  expr *expr_local;
  
  memset(&right.ex_end,0,0x18);
  memset(&local_88,0,0x18);
  right.ex_end = (ex_ex *)0x0;
  right.ex_cont.v_int = 0;
  local_88.v_int = 0;
  if (eptr == (ex_ex *)0x0) {
    return (ex_ex *)0x0;
  }
  switch(eptr->ex_type) {
  case 1:
    if (optr->ex_type == 0xf) {
      ex_mkvector((optr->ex_cont).v_vec,(float)(eptr->ex_cont).v_int,expr->exp_vsize);
    }
    else {
      optr->ex_cont = eptr->ex_cont;
      optr->ex_type = eptr->ex_type;
      optr->ex_end = eptr->ex_end;
    }
    expr_local = (expr *)(eptr + 1);
    break;
  case 2:
    if (optr->ex_type == 0xf) {
      ex_mkvector((optr->ex_cont).v_vec,(eptr->ex_cont).v_flt,expr->exp_vsize);
    }
    else {
      optr->ex_cont = eptr->ex_cont;
      optr->ex_type = eptr->ex_type;
      optr->ex_end = eptr->ex_end;
    }
    expr_local = (expr *)(eptr + 1);
    break;
  case 3:
    if (eptr[1].ex_type == 0) {
      pd_error(expr,"expr: ex_eval: not enough nodes 1\n");
      return (ex_ex *)0x0;
    }
    if (((((eptr->ex_cont).v_int != 0xe0017) && ((eptr->ex_cont).v_int != 0xe0016)) &&
        ((eptr->ex_cont).v_int != 0xe0015)) && (eptr[2].ex_type == 0)) {
      pd_error(expr,"expr: ex_eval: not enough nodes 2\n");
      return (ex_ex *)0x0;
    }
    peVar3 = eptr + 1;
    lVar1 = (eptr->ex_cont).v_int;
    if ((lVar1 == 0x10001) || (lVar1 == 0x20002)) {
LAB_001e1af0:
      pd_error(expr,"expr: ex_print: bad op 0x%x\n",(peVar3->ex_cont).v_int & 0xffffffff);
      expr_local = (expr *)0x0;
    }
    else {
      if (lVar1 == 0x3001c) {
        peVar3 = eval_store(expr,peVar3,optr,idx);
        return peVar3;
      }
      if (lVar1 == 0x40003) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4e4,0);
        bVar2 = false;
      }
      else if (lVar1 == 0x50004) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4e2,0);
        bVar2 = false;
      }
      else if (lVar1 == 0x60005) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4e0,0);
        bVar2 = false;
      }
      else if (lVar1 == 0x70006) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4de,0);
        bVar2 = false;
      }
      else if (lVar1 == 0x80007) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4dc,0);
        bVar2 = false;
      }
      else if (lVar1 == 0x90008) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4d1,0);
        bVar2 = false;
      }
      else if (lVar1 == 0x90009) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4cf,0);
        bVar2 = false;
      }
      else if (lVar1 == 0xa000a) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4cd,0);
        bVar2 = false;
      }
      else if (lVar1 == 0xa000b) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4cb,0);
        bVar2 = false;
      }
      else if (lVar1 == 0xa000c) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4c9,0);
        bVar2 = false;
      }
      else if (lVar1 == 0xa000d) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4c7,0);
        bVar2 = false;
      }
      else if (lVar1 == 0xb000e) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4da,0);
        bVar2 = false;
      }
      else if (lVar1 == 0xb000f) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4d8,0);
        bVar2 = false;
      }
      else if (lVar1 == 0xc0010) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4c5,0);
        bVar2 = false;
      }
      else if (lVar1 == 0xc0011) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4c3,0);
        bVar2 = false;
      }
      else if (lVar1 == 0xd0012) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4ec,0);
        bVar2 = false;
      }
      else if (lVar1 == 0xd0013) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4f3,0);
        bVar2 = false;
      }
      else if (lVar1 == 0xd0014) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&local_88,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4c1,0);
        bVar2 = false;
      }
      else if (lVar1 == 0xe0015) {
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4bf,0);
        bVar2 = true;
      }
      else if (lVar1 == 0xe0016) {
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4bd,0);
        bVar2 = true;
      }
      else {
        if (lVar1 != 0xe0017) goto LAB_001e1af0;
        optr_local = ex_eval(expr,peVar3,(ex_ex *)&right.ex_end,idx);
        pd_error(expr,"expr: ex_eval(%d): bad left type %ld\n",0x4bb,0);
        bVar2 = true;
      }
      if (right.ex_cont.v_int == 0xf) {
        free(local_88.v_vec);
      }
      if (bVar2) {
        expr_local = (expr *)0x0;
      }
      else {
        expr_local = (expr *)optr_local;
      }
    }
    break;
  case 4:
  case 9:
  case 10:
  default:
    pd_error(expr,"expr: ex_eval: unexpected type %d\n",eptr->ex_type & 0xffffffff);
    expr_local = (expr *)0x0;
    break;
  case 5:
  case 0xd:
    expr_local = (expr *)eval_tab(expr,eptr,optr,idx);
    break;
  case 6:
    expr_local = (expr *)eval_func(expr,eptr,optr,idx);
    break;
  case 7:
    if (optr->ex_type == 0xf) {
      pd_error(expr,"expr: ex_eval: cannot turn string to vector\n");
      expr_local = (expr *)0x0;
    }
    else {
      optr->ex_cont = eptr->ex_cont;
      optr->ex_type = eptr->ex_type;
      optr->ex_end = eptr->ex_end;
      expr_local = (expr *)(eptr + 1);
    }
    break;
  case 8:
    if (optr->ex_type == 0xf) {
      pd_error(expr,"expr: IntErr. vsym in for vec out\n");
      expr_local = (expr *)0x0;
    }
    else if ((eptr->ex_cont).v_int == -1) {
      pd_error(expr,"expr: ex_eval: inlet number not set\n");
      expr_local = (expr *)0x0;
    }
    else {
      optr->ex_type = 7;
      optr->ex_cont = expr->exp_var[(eptr->ex_cont).v_int].ex_cont;
      expr_local = (expr *)(eptr + 1);
    }
    break;
  case 0xb:
    if ((eptr->ex_cont).v_int == -1) {
      pd_error(expr,"expr: ex_eval: inlet number not set\n");
      expr_local = (expr *)0x0;
    }
    else {
      if (optr->ex_type == 0xf) {
        ex_mkvector((optr->ex_cont).v_vec,(float)expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_int,
                    expr->exp_vsize);
      }
      else {
        optr->ex_type = 1;
        optr->ex_cont = expr->exp_var[(eptr->ex_cont).v_int].ex_cont;
      }
      expr_local = (expr *)(eptr + 1);
    }
    break;
  case 0xc:
    if ((eptr->ex_cont).v_int == -1) {
      pd_error(expr,"expr: ex_eval: inlet number not set\n");
      expr_local = (expr *)0x0;
    }
    else {
      if (optr->ex_type == 0xf) {
        ex_mkvector((optr->ex_cont).v_vec,expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_flt,
                    expr->exp_vsize);
      }
      else {
        optr->ex_type = 2;
        (optr->ex_cont).v_flt = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_flt;
      }
      expr_local = (expr *)(eptr + 1);
    }
    break;
  case 0xe:
    if (optr->ex_type == 0xf) {
      if ((optr->ex_cont).v_int != expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_int) {
        memcpy((optr->ex_cont).v_vec,expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_vec,
               (long)expr->exp_vsize << 2);
      }
    }
    else {
      paVar4 = &expr->exp_var[(eptr->ex_cont).v_int].ex_cont;
      optr->ex_cont = *paVar4;
      optr->ex_type = (long)paVar4[1];
      optr->ex_end = (ex_ex *)paVar4[2];
    }
    expr_local = (expr *)(eptr + 1);
    break;
  case 0xf:
    if (optr->ex_type == 0xf) {
      if ((optr->ex_cont).v_int == (eptr->ex_cont).v_int) {
        post("expr int. error, optr->ex_vec = %d",(optr->ex_cont).v_int);
        abort();
      }
      memcpy((optr->ex_cont).v_vec,(eptr->ex_cont).v_vec,(long)expr->exp_vsize << 2);
      free((eptr->ex_cont).v_vec);
    }
    else {
      optr->ex_type = 0xf;
      optr->ex_cont = eptr->ex_cont;
      eptr->ex_type = 1;
      (eptr->ex_cont).v_int = 0;
    }
    expr_local = (expr *)(eptr + 1);
    break;
  case 0x10:
  case 0x12:
    if (((expr->exp_flags & 7U | 4) != 4) || (optr->ex_type == 0xf)) {
      post("%d:expr->exp_flags = %d",0x495,(ulong)(uint)expr->exp_flags);
      abort();
    }
    expr_local = (expr *)eval_sigidx(expr,eptr,optr,idx);
    break;
  case 0x11:
    optr->ex_type = 2;
    if (idx == 0) {
      (optr->ex_cont).v_flt = expr->exp_p_res[(eptr->ex_cont).v_int][expr->exp_vsize + -1];
    }
    else {
      (optr->ex_cont).v_flt = expr->exp_tmpres[(eptr->ex_cont).v_int][idx + -1];
    }
    expr_local = (expr *)(eptr + 1);
    break;
  case 0x14:
    if (((expr->exp_flags & 7U | 4) != 4) || (optr->ex_type == 0xf)) {
      post("%d:exp->exp_flags = %d",0x47d,(ulong)(uint)expr->exp_flags);
      abort();
    }
    optr->ex_type = 2;
    (optr->ex_cont).v_flt = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_vec[idx];
    expr_local = (expr *)(eptr + 1);
    break;
  case 0x15:
    expr_local = (expr *)eval_var(expr,eptr,optr,idx);
  }
  return (ex_ex *)expr_local;
}

Assistant:

struct ex_ex *
ex_eval(struct expr *expr, struct ex_ex *eptr, struct ex_ex *optr, int idx)
/* the expr object data pointer */
/* the operation stack */
/* the result pointer */
/* the sample number processed for fexpr~ */
{
        int i, j;
        t_float *lp, *rp, *op; /* left, right, and out pointer to vectors */
        t_float scalar;
        int nullret = 0;                /* did we have an error */
        struct ex_ex left = { 0 }, right = { 0 };       /* left and right operands */

        left.ex_type = 0;
        left.ex_int = 0;
        right.ex_type = 0;
        right.ex_int = 0;

        if (!eptr)
                return (exNULL);
        switch (eptr->ex_type) {
        case ET_INT:
                if (optr->ex_type == ET_VEC)
                        ex_mkvector(optr->ex_vec, (t_float) eptr->ex_int,
                                                                expr->exp_vsize);
                else
                        *optr = *eptr;
                return (++eptr);

        case ET_FLT:

                if (optr->ex_type == ET_VEC)
                        ex_mkvector(optr->ex_vec, eptr->ex_flt, expr->exp_vsize);
                else
                        *optr = *eptr;
                return (++eptr);

        case ET_SYM:
                if (optr->ex_type == ET_VEC) {
                        post_error((fts_object_t *) expr,
                              "expr: ex_eval: cannot turn string to vector\n");
                        return (exNULL);
                }
                *optr = *eptr;
                return (++eptr);
        case ET_II:
                if (eptr->ex_int == -1) {
                        post_error((fts_object_t *) expr,
                            "expr: ex_eval: inlet number not set\n");
                        return (exNULL);
                }
                if (optr->ex_type == ET_VEC) {
                        ex_mkvector(optr->ex_vec,
                               (t_float)expr->exp_var[eptr->ex_int].ex_int,
                                                                expr->exp_vsize);
                } else {
                        optr->ex_type = ET_INT;
                        optr->ex_int = expr->exp_var[eptr->ex_int].ex_int;
                }
                return (++eptr);
        case ET_FI:
                if (eptr->ex_int == -1) {
                        post_error((fts_object_t *) expr,
                            "expr: ex_eval: inlet number not set\n");
                        return (exNULL);
                }
                if (optr->ex_type == ET_VEC) {
                        ex_mkvector(optr->ex_vec,
                             expr->exp_var[eptr->ex_int].ex_flt, expr->exp_vsize);
                } else {
                        optr->ex_type = ET_FLT;
                        optr->ex_flt = expr->exp_var[eptr->ex_int].ex_flt;
                }
                return (++eptr);

        case ET_VSYM:
                if (optr->ex_type == ET_VEC) {
                        post_error((fts_object_t *) expr,
                            "expr: IntErr. vsym in for vec out\n");
                        return (exNULL);
                }
                if (eptr->ex_int == -1) {
                        post_error((fts_object_t *) expr,
                                "expr: ex_eval: inlet number not set\n");
                        return (exNULL);
                }
                optr->ex_type = ET_SYM;
                optr->ex_ptr = expr->exp_var[eptr->ex_int].ex_ptr;
                return(++eptr);

        case ET_VI:
                if (optr->ex_type != ET_VEC)
                        *optr = expr->exp_var[eptr->ex_int];
                else if (optr->ex_vec != expr->exp_var[eptr->ex_int].ex_vec)
                        memcpy(optr->ex_vec, expr->exp_var[eptr->ex_int].ex_vec,
                                        expr->exp_vsize * sizeof (t_float));
                return(++eptr);
        case ET_VEC:
                if (optr->ex_type != ET_VEC) {
                        optr->ex_type = ET_VEC;
                        optr->ex_vec = eptr->ex_vec;
                        eptr->ex_type = ET_INT;
                        eptr->ex_int = 0;
                } else if (optr->ex_vec != eptr->ex_vec) {
                        memcpy(optr->ex_vec, eptr->ex_vec,
                                        expr->exp_vsize * sizeof (t_float));
                        fts_free(eptr->ex_vec);
                } else { /* this should not happen */
                        post("expr int. error, optr->ex_vec = %d",optr->ex_vec);
                        abort();
                }
                return(++eptr);
        case ET_XI0:
                /* short hand for $x?[0] */

                /* SDY delete the following check */
                if (!IS_FEXPR_TILDE(expr) || optr->ex_type==ET_VEC) {
                        post("%d:exp->exp_flags = %d", __LINE__,expr->exp_flags);
                        abort();
                }
                optr->ex_type = ET_FLT;
                optr->ex_flt = expr->exp_var[eptr->ex_int].ex_vec[idx];
                return(++eptr);
        case ET_YOM1:
                /*
                 * short hand for $y?[-1]
                 * if we are calculating the first sample of the vector
                 * we need to look at the previous results buffer
                 */
                optr->ex_type = ET_FLT;
                if (idx == 0)
                        optr->ex_flt =
                        expr->exp_p_res[eptr->ex_int][expr->exp_vsize - 1];
                else
                        optr->ex_flt=expr->exp_tmpres[eptr->ex_int][idx-1];
                return(++eptr);

        case ET_YO:
        case ET_XI:
                /* SDY delete the following */
                if (!IS_FEXPR_TILDE(expr) || optr->ex_type==ET_VEC) {
                        post("%d:expr->exp_flags = %d", __LINE__,expr->exp_flags);
                        abort();
                }
                return (eval_sigidx(expr, eptr, optr, idx));

        case ET_TBL:
        case ET_SI:
                return (eval_tab(expr, eptr, optr, idx));
        case ET_FUNC:
                return (eval_func(expr, eptr, optr, idx));
        case ET_VAR:
                return (eval_var(expr, eptr, optr, idx));
        case ET_OP:
                break;
        case ET_STR:
        case ET_LP:
        case ET_LB:
        default:
                post_error((fts_object_t *) expr,
                        "expr: ex_eval: unexpected type %d\n",
                            (int)eptr->ex_type);
                return (exNULL);
        }
        if (!eptr[1].ex_type) {
                post_error((fts_object_t *) expr,
                                        "expr: ex_eval: not enough nodes 1\n");
                return (exNULL);
        }
        if (!unary_op(eptr->ex_op) && !eptr[2].ex_type) {
                post_error((fts_object_t *) expr,
                                        "expr: ex_eval: not enough nodes 2\n");
                return (exNULL);
        }

        switch((eptr++)->ex_op) {
        case OP_STORE:
                return (eval_store(expr, eptr, optr, idx));
        case OP_NOT:
                EVAL_UNARY(!, +);
        case OP_NEG:
                EVAL_UNARY(~, (long));
        case OP_UMINUS:
                EVAL_UNARY(-, +);
        case OP_MUL:
                EVAL(*);
        case OP_ADD:
                EVAL(+);
        case OP_SUB:
                EVAL(-);
        case OP_LT:
                EVAL(<);
        case OP_LE:
                EVAL(<=);
        case OP_GT:
                EVAL(>);
        case OP_GE:
                EVAL(>=);
        case OP_EQ:
                EVAL(==);
        case OP_NE:
                EVAL(!=);
/*
 * following operators convert their argument to integer
 */
#undef DZC
#define DZC(ARG1,OPR,ARG2)      (((int)ARG1) OPR ((int)ARG2))
        case OP_SL:
                EVAL(<<);
        case OP_SR:
                EVAL(>>);
        case OP_AND:
                EVAL(&);
        case OP_XOR:
                EVAL(^);
        case OP_OR:
                EVAL(|);
        case OP_LAND:
                EVAL(&&);
        case OP_LOR:
                EVAL(||);
/*
 * for modulo we need to convert to integer and check for divide by zero
 */
#undef DZC
#define DZC(ARG1,OPR,ARG2)      ((((int)ARG2)?(((int)ARG1) OPR ((int)ARG2)) \
                                                        : (ex_dzdetect(expr),0)))
        case OP_MOD:
                EVAL(%);
/*
 * define the divide by zero check for divide
 */
#undef DZC
#define DZC(ARG1,OPR,ARG2)      (((ARG2)?(ARG1 OPR ARG2):(ex_dzdetect(expr),0)))
        case OP_DIV:
                EVAL(/);
        case OP_LP:
        case OP_RP:
        case OP_LB:
        case OP_RB:
        case OP_COMMA:
        case OP_SEMI:
        default:
                post_error((fts_object_t *) expr,
                    "expr: ex_print: bad op 0x%x\n", (unsigned)eptr->ex_op);
                return (exNULL);
        }


        /*
         * the left and right nodes could have been transformed to vectors
         * down the chain
         */
        if (left.ex_type == ET_VEC)
                fts_free(left.ex_vec);
        if (right.ex_type == ET_VEC)
                fts_free(right.ex_vec);
        if (nullret)
                return (exNULL);
        else
                return (eptr);
}